

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

void __thiscall cmQtAutoGenInitializer::InfoWriter::Write(InfoWriter *this,char *key,string *value)

{
  size_t sVar1;
  ostream *poVar2;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"set(",4);
  if (key == (char *)0x0) {
    std::ios::clear((int)this +
                    (int)(this->Ofs_).super_ofstream.
                         super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3])
    ;
  }
  else {
    sVar1 = strlen(key);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,key,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
  cmOutputConverter::EscapeForCMake(&local_38,value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::InfoWriter::Write(const char* key,
                                               std::string const& value)
{
  Ofs_ << "set(" << key << " " << cmOutputConverter::EscapeForCMake(value)
       << ")\n";
}